

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  Rep *pRVar2;
  int iVar3;
  Extension *pEVar4;
  LogMessage *pLVar5;
  Descriptor *pDVar6;
  undefined4 extraout_var;
  MessageLite *pMVar8;
  LogFinisher local_69;
  LogMessage local_68;
  long *plVar7;
  
  pEVar4 = MaybeNewRepeatedExtension(this,descriptor);
  pRVar1 = (pEVar4->field_0).repeated_string_value;
  pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar3 = (pRVar1->super_RepeatedPtrFieldBase).current_size_;
    if (iVar3 < pRVar2->allocated_size) {
      (pRVar1->super_RepeatedPtrFieldBase).current_size_ = iVar3 + 1;
      pMVar8 = (MessageLite *)pRVar2->elements[iVar3];
      goto LAB_005bc901;
    }
  }
  pMVar8 = (MessageLite *)0x0;
LAB_005bc901:
  if (pMVar8 == (MessageLite *)0x0) {
    pRVar1 = (pEVar4->field_0).repeated_string_value;
    iVar3 = (pRVar1->super_RepeatedPtrFieldBase).current_size_;
    if (iVar3 == 0) {
      pDVar6 = FieldDescriptor::message_type(descriptor);
      iVar3 = (*factory->_vptr_MessageFactory[2])(factory,pDVar6);
      plVar7 = (long *)CONCAT44(extraout_var,iVar3);
      if (plVar7 == (long *)0x0) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x10a);
        pLVar5 = LogMessage::operator<<(&local_68,"CHECK failed: prototype != NULL: ");
        LogFinisher::operator=(&local_69,pLVar5);
        LogMessage::~LogMessage(&local_68);
      }
    }
    else {
      if (iVar3 < 1) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar5 = LogMessage::operator<<(&local_68,"CHECK failed: (index) < (current_size_): ");
        LogFinisher::operator=(&local_69,pLVar5);
        LogMessage::~LogMessage(&local_68);
      }
      plVar7 = (long *)((pRVar1->super_RepeatedPtrFieldBase).rep_)->elements[0];
    }
    pMVar8 = (MessageLite *)(**(code **)(*plVar7 + 0x20))(plVar7,this->arena_);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(pEVar4->field_0).int64_value,pMVar8);
  }
  return pMVar8;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension = MaybeNewRepeatedExtension(descriptor);

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = extension->repeated_message_value
      ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    const MessageLite* prototype;
    if (extension->repeated_message_value->size() == 0) {
      prototype = factory->GetPrototype(descriptor->message_type());
      GOOGLE_CHECK(prototype != NULL);
    } else {
      prototype = &extension->repeated_message_value->Get(0);
    }
    result = prototype->New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}